

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

short duckdb::BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,short,short,short>
                (bool fun,short left,short right,ValidityMask *mask,idx_t idx)

{
  short sVar1;
  undefined8 uVar2;
  short in_DX;
  short in_SI;
  idx_t in_stack_ffffffffffffff98;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffa0;
  allocator *paVar3;
  allocator local_39;
  string local_38 [12];
  short in_stack_ffffffffffffffd4;
  short in_stack_ffffffffffffffd6;
  string *in_stack_ffffffffffffffd8;
  OutOfRangeException *in_stack_ffffffffffffffe0;
  short local_2;
  
  sVar1 = NumericLimits<short>::Minimum();
  if ((in_SI == sVar1) && (in_DX == -1)) {
    uVar2 = __cxa_allocate_exception(0x10);
    paVar3 = &local_39;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Overflow in division of %d / %d",paVar3);
    OutOfRangeException::OutOfRangeException<short,short>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd6,
               in_stack_ffffffffffffffd4);
    __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  if (in_DX == 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_2 = in_SI;
  }
  else {
    local_2 = DivideOperator::Operation<short,short,short>(in_SI,in_DX);
  }
  return local_2;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		if (left == NumericLimits<LEFT_TYPE>::Minimum() && right == -1) {
			throw OutOfRangeException("Overflow in division of %d / %d", left, right);
		} else if (right == 0) {
			mask.SetInvalid(idx);
			return left;
		} else {
			return OP::template Operation<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(left, right);
		}
	}